

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O3

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::PropagateResult<mp::QuadAndLinTerms,mp::AlgConRhs<2>>
          (ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_> *con,Context ctx)

{
  Context ctx_00;
  double lb;
  
  lb = (con->super_AlgConRhs<2>).rhs_;
  if (lb <= -1e+20) {
    ctx_00.value_ = CTX_NEG;
    if (CTX_POS < ctx.value_) {
      lb = -INFINITY;
      ctx_00.value_ = ctx.value_;
      if (ctx.value_ == CTX_NEG) {
        ctx_00.value_ = CTX_POS;
      }
      goto LAB_001fcdde;
    }
  }
  else {
    ctx_00.value_ = CTX_POS;
    if (CTX_POS < ctx.value_) {
      ctx_00.value_ = ctx.value_;
    }
  }
  if (ctx.value_ != CTX_ROOT) {
    lb = -INFINITY;
  }
LAB_001fcdde:
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::PropagateResult2QuadAndLinTerms
            ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)this,&con->super_QuadAndLinTerms,lb,INFINITY,ctx_00);
  return;
}

Assistant:

double rhs() const { return rhs_; }